

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_quote(connectdata *conn,_Bool init,ftpstate instate)

{
  anon_union_240_10_26c073a1_for_proto *pp;
  Curl_easy *pCVar1;
  void *pvVar2;
  int iVar3;
  CURLcode CVar4;
  long lVar5;
  undefined8 *puVar6;
  char *pcVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  
  pCVar1 = conn->data;
  lVar5 = 0x9e8;
  if (instate - FTP_RETR_PREQUOTE < 3) {
    lVar5 = *(long *)(&DAT_00149840 + (ulong)(instate - FTP_RETR_PREQUOTE) * 8);
  }
  puVar6 = *(undefined8 **)((long)pCVar1->sockets + lVar5 + -0x80);
  CVar4 = CURLE_OK;
  iVar3 = 0;
  if (!init) {
    iVar3 = (conn->proto).ftpc.count1 + 1;
  }
  pvVar2 = (pCVar1->req).protop;
  pp = &conn->proto;
  (conn->proto).ftpc.count1 = iVar3;
  if (puVar6 == (undefined8 *)0x0) {
    bVar9 = false;
  }
  else {
    iVar3 = (conn->proto).ftpc.count1;
    bVar10 = true;
    if (iVar3 < 1) {
      bVar9 = true;
    }
    else {
      iVar8 = 1;
      do {
        puVar6 = (undefined8 *)puVar6[1];
        bVar9 = puVar6 != (undefined8 *)0x0;
        if (iVar3 <= iVar8) break;
        iVar8 = iVar8 + 1;
      } while (puVar6 != (undefined8 *)0x0);
    }
    if (bVar9) {
      pcVar7 = (char *)*puVar6;
      bVar9 = *pcVar7 == '*';
      *(uint *)((long)&conn->proto + 0xb4) = (uint)bVar9;
      CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"%s",pcVar7 + bVar9);
      bVar10 = CVar4 == CURLE_OK;
      bVar9 = bVar10;
      if (bVar10) {
        (conn->proto).ftpc.state = instate;
      }
    }
    else {
      CVar4 = CURLE_OK;
      bVar9 = false;
    }
    if (!bVar10) {
      return CVar4;
    }
  }
  if (!bVar9) {
    if (instate == FTP_RETR_PREQUOTE) {
      if (*(int *)((long)pvVar2 + 0x28) == 0) {
        lVar5 = (conn->proto).ftpc.known_filesize;
        if (lVar5 != -1) {
          Curl_pgrsSetDownloadSize(pCVar1,lVar5);
          CVar4 = ftp_state_retr(conn,(conn->proto).ftpc.known_filesize);
          return CVar4;
        }
        pcVar7 = (conn->proto).ftpc.file;
        if ((pCVar1->set).ignorecl == true) {
          CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"RETR %s",pcVar7);
          if (CVar4 == CURLE_OK) {
            (conn->proto).ftpc.state = FTP_RETR;
            CVar4 = CURLE_OK;
          }
        }
        else {
          CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"SIZE %s",pcVar7);
          if (CVar4 == CURLE_OK) {
            (conn->proto).ftpc.state = FTP_RETR_SIZE;
            CVar4 = CURLE_OK;
          }
        }
      }
      else {
        (conn->proto).ftpc.state = FTP_STOP;
      }
    }
    else {
      if (instate == FTP_STOR_PREQUOTE) {
        CVar4 = ftp_state_ul_setup(conn,false);
        return CVar4;
      }
      if (instate != FTP_POSTQUOTE) {
        if ((conn->proto).ftpc.cwddone != true) {
          (conn->proto).ftpc.count2 = 0;
          pCVar1 = conn->data;
          *(uint *)((long)&conn->proto + 0xb8) = (uint)((pCVar1->set).ftp_create_missing_dirs == 2);
          if (((pCVar1->set).ftp_filemethod != FTPFILE_NOCWD) || ((conn->proto).ftpc.cwdcount != 0))
          {
            if (((conn->bits).reuse == true) &&
               (pcVar7 = (conn->proto).ftpc.entrypath, pcVar7 != (char *)0x0)) {
              (conn->proto).ftpc.cwdcount = 0;
            }
            else {
              if ((conn->proto).ftpc.dirdepth == 0) goto LAB_0013b75a;
              (conn->proto).ftpc.cwdcount = 1;
              pcVar7 = *(conn->proto).ftpc.dirs;
            }
            CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"CWD %s",pcVar7);
            if (CVar4 != CURLE_OK) {
              return CVar4;
            }
            (conn->proto).ftpc.state = FTP_CWD;
            return CURLE_OK;
          }
        }
LAB_0013b75a:
        CVar4 = ftp_state_mdtm(conn);
        return CVar4;
      }
    }
  }
  return CVar4;
}

Assistant:

static CURLcode ftp_state_quote(struct connectdata *conn,
                                bool init,
                                ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  bool quote = FALSE;
  struct curl_slist *item;

  switch(instate) {
  case FTP_QUOTE:
  default:
    item = data->set.quote;
    break;
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
    item = data->set.prequote;
    break;
  case FTP_POSTQUOTE:
    item = data->set.postquote;
    break;
  }

  /*
   * This state uses:
   * 'count1' to iterate over the commands to send
   * 'count2' to store whether to allow commands to fail
   */

  if(init)
    ftpc->count1 = 0;
  else
    ftpc->count1++;

  if(item) {
    int i = 0;

    /* Skip count1 items in the linked list */
    while((i< ftpc->count1) && item) {
      item = item->next;
      i++;
    }
    if(item) {
      char *cmd = item->data;
      if(cmd[0] == '*') {
        cmd++;
        ftpc->count2 = 1; /* the sent command is allowed to fail */
      }
      else
        ftpc->count2 = 0; /* failure means cancel operation */

      PPSENDF(&ftpc->pp, "%s", cmd);
      state(conn, instate);
      quote = TRUE;
    }
  }

  if(!quote) {
    /* No more quote to send, continue to ... */
    switch(instate) {
    case FTP_QUOTE:
    default:
      result = ftp_state_cwd(conn);
      break;
    case FTP_RETR_PREQUOTE:
      if(ftp->transfer != FTPTRANSFER_BODY)
        state(conn, FTP_STOP);
      else {
        if(ftpc->known_filesize != -1) {
          Curl_pgrsSetDownloadSize(data, ftpc->known_filesize);
          result = ftp_state_retr(conn, ftpc->known_filesize);
        }
        else {
          if(data->set.ignorecl) {
            /* This code is to support download of growing files.  It prevents
               the state machine from requesting the file size from the
               server.  With an unknown file size the download continues until
               the server terminates it, otherwise the client stops if the
               received byte count exceeds the reported file size.  Set option
               CURLOPT_IGNORE_CONTENT_LENGTH to 1 to enable this behavior.*/
            PPSENDF(&ftpc->pp, "RETR %s", ftpc->file);
            state(conn, FTP_RETR);
          }
          else {
            PPSENDF(&ftpc->pp, "SIZE %s", ftpc->file);
            state(conn, FTP_RETR_SIZE);
          }
        }
      }
      break;
    case FTP_STOR_PREQUOTE:
      result = ftp_state_ul_setup(conn, FALSE);
      break;
    case FTP_POSTQUOTE:
      break;
    }
  }

  return result;
}